

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_gzip.c
# Opt level: O3

int archive_compressor_gzip_write(archive_write_filter *f,void *buff,size_t length)

{
  private_data_conflict6 *data;
  int iVar1;
  uLong uVar2;
  
  data = (private_data_conflict6 *)f->data;
  uVar2 = cm_zlib_crc32(data->crc,(uchar *)buff,(uint)length);
  data->crc = uVar2;
  data->total_in = data->total_in + length;
  (data->stream).next_in = (Bytef *)buff;
  (data->stream).avail_in = (uint)length;
  iVar1 = drive_compressor(f,data,0);
  return iVar1;
}

Assistant:

static int
archive_compressor_gzip_write(struct archive_write_filter *f, const void *buff,
    size_t length)
{
	struct private_data *data = (struct private_data *)f->data;
	int ret;

	/* Update statistics */
	data->crc = crc32(data->crc, (const Bytef *)buff, (uInt)length);
	data->total_in += length;

	/* Compress input data to output buffer */
	SET_NEXT_IN(data, buff);
	data->stream.avail_in = (uInt)length;
	if ((ret = drive_compressor(f, data, 0)) != ARCHIVE_OK)
		return (ret);

	return (ARCHIVE_OK);
}